

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall
OpenMD::HBondJump::processNonOverlapping
          (HBondJump *this,int frame,SelectionManager *sman1,SelectionManager *sman2)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  pointer ppHVar4;
  long lVar5;
  pointer ppAVar6;
  pointer ppAVar7;
  pointer pvVar8;
  long lVar9;
  Molecule *pMVar10;
  HBondDonor *pHVar11;
  pointer ppHVar12;
  int iVar13;
  pointer ppAVar14;
  Atom *pAVar15;
  int j;
  int i;
  Molecule *local_68;
  int local_60;
  int local_5c;
  long local_58;
  SelectionManager *local_50;
  long local_48;
  SelectionManager *local_40;
  long local_38;
  
  local_50 = sman2;
  local_40 = sman1;
  local_68 = SelectionManager::beginSelectedMolecule(sman1,&local_5c);
  if (local_68 != (Molecule *)0x0) {
    local_48 = (long)frame;
    local_58 = local_48 * 0x18;
    do {
      pMVar10 = SelectionManager::beginSelectedMolecule(local_50,&local_60);
      while (pMVar10 != (Molecule *)0x0) {
        ppHVar12 = (local_68->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppHVar4 = (local_68->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((ppHVar12 != ppHVar4) && (pHVar11 = *ppHVar12, pHVar11 != (HBondDonor *)0x0)) {
          local_38 = *(long *)((long)&(((this->GIDtoH_).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data + local_58);
          lVar5 = *(long *)((long)&(((this->acceptor_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_58);
          ppAVar6 = (pMVar10->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar7 = (pMVar10->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if ((ppAVar6 != ppAVar7) && (pAVar15 = *ppAVar6, pAVar15 != (Atom *)0x0)) {
              iVar2 = *(int *)(local_38 +
                              (long)(pHVar11->donatedHydrogen->super_StuntDouble).globalIndex_ * 4);
              iVar3 = *(int *)(lVar5 + (long)iVar2 * 4);
              pvVar8 = (this->selected_).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar13 = iVar2 + 0x3f;
              if (-1 < iVar2) {
                iVar13 = iVar2;
              }
              ppAVar14 = ppAVar6;
              do {
                ppAVar14 = ppAVar14 + 1;
                if ((pAVar15->super_StuntDouble).globalIndex_ == iVar3) {
                  puVar1 = (ulong *)((ulong)(((long)iVar2 & 0x800000000000003fU) <
                                            0x8000000000000001) * 8 + -8 +
                                    *(long *)&pvVar8[local_48].
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data + (long)(iVar13 >> 6) * 8);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                }
                if (ppAVar14 == ppAVar7) break;
                pAVar15 = *ppAVar14;
              } while (pAVar15 != (Atom *)0x0);
            }
            ppHVar12 = ppHVar12 + 1;
          } while ((ppHVar12 != ppHVar4) && (pHVar11 = *ppHVar12, pHVar11 != (HBondDonor *)0x0));
        }
        ppHVar12 = (pMVar10->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppHVar4 = (pMVar10->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((ppHVar12 != ppHVar4) && (pHVar11 = *ppHVar12, pHVar11 != (HBondDonor *)0x0)) {
          lVar5 = *(long *)((long)&(((this->GIDtoH_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_58);
          lVar9 = *(long *)((long)&(((this->acceptor_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_58);
          ppAVar6 = (local_68->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppAVar7 = (local_68->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if ((ppAVar6 != ppAVar7) && (pAVar15 = *ppAVar6, pAVar15 != (Atom *)0x0)) {
              iVar2 = *(int *)(lVar5 + (long)(pHVar11->donatedHydrogen->super_StuntDouble).
                                             globalIndex_ * 4);
              iVar3 = *(int *)(lVar9 + (long)iVar2 * 4);
              pvVar8 = (this->selected_).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar13 = iVar2 + 0x3f;
              if (-1 < iVar2) {
                iVar13 = iVar2;
              }
              ppAVar14 = ppAVar6;
              do {
                ppAVar14 = ppAVar14 + 1;
                if ((pAVar15->super_StuntDouble).globalIndex_ == iVar3) {
                  puVar1 = (ulong *)((ulong)(((long)iVar2 & 0x800000000000003fU) <
                                            0x8000000000000001) * 8 + -8 +
                                    *(long *)&pvVar8[local_48].
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data + (long)(iVar13 >> 6) * 8);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                }
                if (ppAVar14 == ppAVar7) break;
                pAVar15 = *ppAVar14;
              } while (pAVar15 != (Atom *)0x0);
            }
            ppHVar12 = ppHVar12 + 1;
          } while ((ppHVar12 != ppHVar4) && (pHVar11 = *ppHVar12, pHVar11 != (HBondDonor *)0x0));
        }
        pMVar10 = SelectionManager::nextSelectedMolecule(local_50,&local_60);
      }
      local_68 = SelectionManager::nextSelectedMolecule(local_40,&local_5c);
    } while (local_68 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJump::processNonOverlapping(int frame, SelectionManager& sman1,
                                        SelectionManager& sman2) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    for (mol1 = sman1.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman1.nextSelectedMolecule(i)) {
      for (mol2 = sman2.beginSelectedMolecule(j); mol2 != NULL;
           mol2 = sman2.nextSelectedMolecule(j)) {
        // loop over the possible donors in molecule 1:
        for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol1->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }

        // loop over the possible donors in molecule 2:
        for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
             hbd = mol2->nextHBondDonor(hbdi)) {
          hInd  = hbd->donatedHydrogen->getGlobalIndex();
          index = GIDtoH_[frame][hInd];
          aInd  = acceptor_[frame][index];

          for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol1->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }